

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseGenericSelectionExpression_AtFirst(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *this_00;
  ostream *poVar3;
  GenericSelectionExpressionSyntax *pGVar4;
  IndexType IVar5;
  bool local_31;
  GenericSelectionExpressionSyntax *selExpr;
  ExpressionSyntax **expr_local;
  Parser *this_local;
  
  this_00 = peek(this,1);
  SVar2 = SyntaxToken::kind(this_00);
  if (SVar2 == Keyword__Generic) {
    pGVar4 = makeNode<psy::C::GenericSelectionExpressionSyntax>(this);
    *expr = &pGVar4->super_ExpressionSyntax;
    IVar5 = consume(this);
    pGVar4->genericKwTkIdx_ = IVar5;
    bVar1 = match(this,OpenParenToken,&pGVar4->openParenTkIdx_);
    local_31 = false;
    if (bVar1) {
      bVar1 = parseExpressionWithPrecedenceAssignment(this,&pGVar4->expr_);
      local_31 = false;
      if (bVar1) {
        bVar1 = match(this,CommaToken,&pGVar4->commaTkIdx_);
        local_31 = false;
        if (bVar1) {
          bVar1 = parseGenericAssociationList(this,&pGVar4->assocs_);
          local_31 = false;
          if (bVar1) {
            local_31 = matchOrSkipTo(this,CloseParenToken,&pGVar4->closeParenTkIdx_);
          }
        }
      }
    }
    this_local._7_1_ = local_31;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Expressions.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x106);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"assert failure: `_Generic\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseGenericSelectionExpression_AtFirst(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword__Generic,
                  return false,
                  "assert failure: `_Generic'");

    auto selExpr = makeNode<GenericSelectionExpressionSyntax>();
    expr = selExpr;
    selExpr->genericKwTkIdx_ = consume();

    return match(SyntaxKind::OpenParenToken, &selExpr->openParenTkIdx_)
            && parseExpressionWithPrecedenceAssignment(selExpr->expr_)
            && match(SyntaxKind::CommaToken, &selExpr->commaTkIdx_)
            && parseGenericAssociationList(selExpr->assocs_)
            && matchOrSkipTo(SyntaxKind::CloseParenToken, &selExpr->closeParenTkIdx_);
}